

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.hpp
# Opt level: O1

void __thiscall gamespace::Match::Match(Match *this,Match *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  GameBoard::GameBoard(&this->_board,&other->_board);
  (this->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->_move).
       super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (other->_move).
       super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->_move).
       super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->_move).
  super__Vector_base<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>,_std::allocator<std::unique_ptr<gamespace::Move,_std::default_delete<gamespace::Move>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (other->_on_player_change).
       super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (other->_on_player_change).
       super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->_on_player_change).
       super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->_on_player_change).
  super__Vector_base<gamespace::Match::cb_player_t,_std::allocator<gamespace::Match::cb_player_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->_on_win).
       super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (other->_on_win).
       super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->_on_win).
       super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->_on_win).
  super__Vector_base<std::function<void_(gamespace::Player_&)>,_std::allocator<std::function<void_(gamespace::Player_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->_on_move).
       super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (other->_on_move).
       super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->_on_move).
       super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (other->_on_move).
  super__Vector_base<std::function<void_(gamespace::Move_&)>,_std::allocator<std::function<void_(gamespace::Move_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_player1)._color.field_0.field_0.z = (other->_player1)._color.field_0.field_0.z;
  *(undefined8 *)&(this->_player1)._color.field_0 = *(undefined8 *)&(other->_player1)._color.field_0
  ;
  paVar1 = &(this->_player1)._name.field_2;
  (this->_player1)._name._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->_player1)._name._M_dataplus._M_p;
  paVar4 = &(other->_player1)._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(other->_player1)._name.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_player1)._name.field_2 + 8) = uVar3;
  }
  else {
    (this->_player1)._name._M_dataplus._M_p = pcVar2;
    (this->_player1)._name.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->_player1)._name._M_string_length = (other->_player1)._name._M_string_length;
  (other->_player1)._name._M_dataplus._M_p = (pointer)paVar4;
  (other->_player1)._name._M_string_length = 0;
  (other->_player1)._name.field_2._M_local_buf[0] = '\0';
  (this->_player2)._color.field_0.field_0.z = (other->_player2)._color.field_0.field_0.z;
  *(undefined8 *)&(this->_player2)._color.field_0 = *(undefined8 *)&(other->_player2)._color.field_0
  ;
  paVar1 = &(this->_player2)._name.field_2;
  (this->_player2)._name._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (other->_player2)._name._M_dataplus._M_p;
  paVar4 = &(other->_player2)._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(other->_player2)._name.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_player2)._name.field_2 + 8) = uVar3;
  }
  else {
    (this->_player2)._name._M_dataplus._M_p = pcVar2;
    (this->_player2)._name.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->_player2)._name._M_string_length = (other->_player2)._name._M_string_length;
  (other->_player2)._name._M_dataplus._M_p = (pointer)paVar4;
  (other->_player2)._name._M_string_length = 0;
  (other->_player2)._name.field_2._M_local_buf[0] = '\0';
  this->_currentPlayer = &this->_player1;
  this->_turn = 0;
  this->_lid = other->_lid;
  other->_currentPlayer = (Player *)0x0;
  (this->_board)._match = this;
  return;
}

Assistant:

Match(Match &&other)
        : _board(std::move(other._board)), _move(std::move(other._move))
        , _on_player_change(std::move(other._on_player_change)), _on_win(std::move(other._on_win))
        , _on_move(std::move(other._on_move))
        , _player1(std::move(other._player1))
        , _player2(std::move(other._player2))
        , _currentPlayer(&_player1), _turn(0), _lid(other._lid) {
            other._currentPlayer = nullptr;
            _board.match() = this;
        }